

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O3

void __thiscall
Rml::GeometryBackgroundBorder::DrawArcArc
          (GeometryBackgroundBorder *this,Vector2f pos_center,float R,Vector2f r,float a0,float a1,
          ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *this_00;
  pointer piVar1;
  code *pcVar2;
  bool bVar3;
  ColourbPremultiplied CVar4;
  pointer piVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float local_68;
  float fStack_64;
  
  if ((((R <= 0.0) || (num_points < 2)) || (r.x <= 0.0)) || (r.y <= 0.0)) {
    bVar3 = Assert("RMLUI_ASSERT(num_points >= 2 && R > 0 && r.x > 0 && r.y > 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                   ,0x104);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  this_00 = this->vertices;
  piVar5 = (this->indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  piVar1 = (this->indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = ((long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize
            (this_00,(long)((int)uVar8 + num_points * 2));
  iVar7 = (int)((ulong)((long)piVar5 - (long)piVar1) >> 2);
  ::std::vector<int,_std::allocator<int>_>::resize
            (this->indices,(long)(iVar7 + (num_points + -1) * 6));
  if (0 < num_points) {
    lVar6 = (long)(int)uVar8 * 0x14;
    uVar9 = 0;
    do {
      fVar10 = (float)(int)uVar9 / (float)(num_points + -1);
      fVar11 = (1.0 - fVar10) * a0 + fVar10 * a1;
      CVar4 = Math::RoundedLerp(fVar10,color0,color1);
      fVar10 = Math::Cos(fVar11);
      fVar11 = Math::Sin(fVar11);
      local_68 = pos_center.x;
      fStack_64 = pos_center.y;
      *(ulong *)((long)&(((this->vertices->
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                          super__Vector_impl_data._M_start)->position).x + lVar6) =
           CONCAT44(fVar11 * r.y + fStack_64,fVar10 * r.x + local_68);
      *(ColourbPremultiplied *)
       ((long)&(((this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                 _M_impl.super__Vector_impl_data._M_start)->colour).red + lVar6) = CVar4;
      *(ulong *)((long)&(this->vertices->
                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                        super__Vector_impl_data._M_start[1].position.x + lVar6) =
           CONCAT44(fVar11 * R + fStack_64,fVar10 * R + local_68);
      *(ColourbPremultiplied *)
       ((long)&(this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
               _M_impl.super__Vector_impl_data._M_start[1].colour.red + lVar6) = CVar4;
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 0x28;
    } while ((uint)num_points != uVar9);
    if (1 < num_points) {
      piVar5 = (this->indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar7;
      lVar6 = 0;
      do {
        iVar7 = (int)uVar8;
        *piVar5 = iVar7;
        piVar5[1] = iVar7 + 2;
        piVar5[2] = iVar7 + 1;
        piVar5[3] = iVar7 + 1;
        piVar5[4] = iVar7 + 2;
        piVar5[5] = iVar7 + 3;
        lVar6 = lVar6 + 2;
        piVar5 = piVar5 + 6;
        uVar8 = (ulong)(iVar7 + 2);
      } while (lVar6 < num_points * 2 + -2);
    }
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArcArc(Vector2f pos_center, float R, Vector2f r, float a0, float a1, ColourbPremultiplied color0,
	ColourbPremultiplied color1, int num_points)
{
	RMLUI_ASSERT(num_points >= 2 && R > 0 && r.x > 0 && r.y > 0);

	const int num_triangles = 2 * (num_points - 1);

	const int offset_vertices = (int)vertices.size();
	const int offset_indices = (int)indices.size();

	vertices.resize(offset_vertices + 2 * num_points);
	indices.resize(offset_indices + 3 * num_triangles);

	for (int i = 0; i < num_points; i++)
	{
		const float t = float(i) / float(num_points - 1);

		const float a = Math::Lerp(t, a0, a1);
		const ColourbPremultiplied color = Math::RoundedLerp(t, color0, color1);
		const Vector2f unit_vector(Math::Cos(a), Math::Sin(a));

		vertices[offset_vertices + 2 * i].position = unit_vector * r + pos_center;
		vertices[offset_vertices + 2 * i].colour = color;
		vertices[offset_vertices + 2 * i + 1].position = unit_vector * R + pos_center;
		vertices[offset_vertices + 2 * i + 1].colour = color;
	}

	for (int i = 0; i < num_triangles; i += 2)
	{
		indices[offset_indices + 3 * i + 0] = offset_vertices + i + 0;
		indices[offset_indices + 3 * i + 1] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 2] = offset_vertices + i + 1;

		indices[offset_indices + 3 * i + 3] = offset_vertices + i + 1;
		indices[offset_indices + 3 * i + 4] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 5] = offset_vertices + i + 3;
	}
}